

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O0

Expression * __thiscall wasm::AlignmentLowering::lowerLoadI32(AlignmentLowering *this,Load *curr)

{
  bool bVar1;
  address64_t aVar2;
  Module *pMVar3;
  Memory *pMVar4;
  Function *func;
  LocalGet *pLVar5;
  Load *pLVar6;
  Load *pLVar7;
  Const *pCVar8;
  Binary *pBVar9;
  Binary *pBVar10;
  Binary *right;
  LocalSet *local_1c0;
  Binary *local_1b8;
  initializer_list<wasm::Expression_*> local_1b0;
  size_t local_1a0;
  char *local_198;
  Type local_190;
  Module *local_188;
  Address local_180;
  size_t local_178;
  char *local_170;
  Type local_168;
  Module *local_160;
  Address local_158;
  size_t local_150;
  char *local_148;
  Type local_140;
  Module *local_138;
  Address local_130;
  size_t local_128;
  char *local_120;
  Type local_118;
  Module *local_110;
  Address local_108;
  size_t local_100;
  char *local_f8;
  Type local_f0;
  Module *local_e8;
  Address local_e0;
  size_t local_d8;
  char *local_d0;
  Type local_c8;
  Module *local_c0;
  Address local_b8;
  size_t local_b0;
  char *local_a8;
  Type local_a0;
  Module *local_98;
  Address local_90;
  size_t local_88;
  char *local_80;
  Type local_78;
  Module *local_70;
  Address local_68;
  Binary *local_60;
  Expression *ret;
  Index local_50;
  BasicType local_4c;
  Index temp;
  Builder builder;
  Type indexType;
  Memory *mem;
  Load *curr_local;
  AlignmentLowering *this_local;
  
  aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
  this_local = (AlignmentLowering *)curr;
  if ((aVar2 != 0) &&
     (aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align), aVar2 != curr->bytes)) {
    pMVar3 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                        ).
                        super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        .
                        super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                      );
    pMVar4 = Module::getMemory(pMVar3,(Name)(curr->memory).super_IString.str);
    builder.wasm = (Module *)(pMVar4->indexType).id;
    pMVar3 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                        ).
                        super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        .
                        super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                      );
    Builder::Builder((Builder *)&temp,pMVar3);
    local_4c = i32;
    bVar1 = wasm::Type::operator==
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                        type,&local_4c);
    if (!bVar1) {
      __assert_fail("curr->type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                    ,0x28,"Expression *wasm::AlignmentLowering::lowerLoadI32(Load *)");
    }
    func = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
           getFunction(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                        ).
                        super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        .
                        super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                      );
    ret = (Expression *)builder.wasm;
    local_50 = Builder::addVar(func,(Type)builder.wasm);
    if (curr->bytes == '\x02') {
      local_68.addr = (curr->offset).addr;
      local_70 = builder.wasm;
      pLVar5 = Builder::makeLocalGet((Builder *)&temp,local_50,(Type)builder.wasm);
      wasm::Type::Type(&local_78,i32);
      local_88 = (curr->memory).super_IString.str._M_len;
      local_80 = (curr->memory).super_IString.str._M_str;
      pLVar6 = Builder::makeLoad((Builder *)&temp,1,false,local_68,1,(Expression *)pLVar5,local_78,
                                 (Name)(curr->memory).super_IString.str);
      aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
      wasm::Address::Address(&local_90,aVar2 + 1);
      local_98 = builder.wasm;
      pLVar5 = Builder::makeLocalGet((Builder *)&temp,local_50,(Type)builder.wasm);
      wasm::Type::Type(&local_a0,i32);
      local_b0 = (curr->memory).super_IString.str._M_len;
      local_a8 = (curr->memory).super_IString.str._M_str;
      pLVar7 = Builder::makeLoad((Builder *)&temp,1,false,local_90,1,(Expression *)pLVar5,local_a0,
                                 (Name)(curr->memory).super_IString.str);
      pCVar8 = Builder::makeConst<int>((Builder *)&temp,8);
      pBVar9 = Builder::makeBinary((Builder *)&temp,ShlInt32,(Expression *)pLVar7,
                                   (Expression *)pCVar8);
      pBVar9 = Builder::makeBinary((Builder *)&temp,OrInt32,(Expression *)pLVar6,
                                   (Expression *)pBVar9);
      local_60 = pBVar9;
      if ((curr->signed_ & 1U) != 0) {
        pMVar3 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          );
        local_60 = (Binary *)Bits::makeSignExt((Expression *)pBVar9,2,pMVar3);
      }
    }
    else {
      if (curr->bytes != '\x04') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0x87);
      }
      aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
      if (aVar2 == 1) {
        local_b8.addr = (curr->offset).addr;
        local_c0 = builder.wasm;
        pLVar5 = Builder::makeLocalGet((Builder *)&temp,local_50,(Type)builder.wasm);
        wasm::Type::Type(&local_c8,i32);
        local_d8 = (curr->memory).super_IString.str._M_len;
        local_d0 = (curr->memory).super_IString.str._M_str;
        pLVar6 = Builder::makeLoad((Builder *)&temp,1,false,local_b8,1,(Expression *)pLVar5,local_c8
                                   ,(Name)(curr->memory).super_IString.str);
        aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
        wasm::Address::Address(&local_e0,aVar2 + 1);
        local_e8 = builder.wasm;
        pLVar5 = Builder::makeLocalGet((Builder *)&temp,local_50,(Type)builder.wasm);
        wasm::Type::Type(&local_f0,i32);
        local_100 = (curr->memory).super_IString.str._M_len;
        local_f8 = (curr->memory).super_IString.str._M_str;
        pLVar7 = Builder::makeLoad((Builder *)&temp,1,false,local_e0,1,(Expression *)pLVar5,local_f0
                                   ,(Name)(curr->memory).super_IString.str);
        pCVar8 = Builder::makeConst<int>((Builder *)&temp,8);
        pBVar9 = Builder::makeBinary((Builder *)&temp,ShlInt32,(Expression *)pLVar7,
                                     (Expression *)pCVar8);
        pBVar9 = Builder::makeBinary((Builder *)&temp,OrInt32,(Expression *)pLVar6,
                                     (Expression *)pBVar9);
        aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
        wasm::Address::Address(&local_108,aVar2 + 2);
        local_110 = builder.wasm;
        pLVar5 = Builder::makeLocalGet((Builder *)&temp,local_50,(Type)builder.wasm);
        wasm::Type::Type(&local_118,i32);
        local_128 = (curr->memory).super_IString.str._M_len;
        local_120 = (curr->memory).super_IString.str._M_str;
        pLVar6 = Builder::makeLoad((Builder *)&temp,1,false,local_108,1,(Expression *)pLVar5,
                                   local_118,(Name)(curr->memory).super_IString.str);
        pCVar8 = Builder::makeConst<int>((Builder *)&temp,0x10);
        pBVar10 = Builder::makeBinary((Builder *)&temp,ShlInt32,(Expression *)pLVar6,
                                      (Expression *)pCVar8);
        aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
        wasm::Address::Address(&local_130,aVar2 + 3);
        local_138 = builder.wasm;
        pLVar5 = Builder::makeLocalGet((Builder *)&temp,local_50,(Type)builder.wasm);
        wasm::Type::Type(&local_140,i32);
        local_150 = (curr->memory).super_IString.str._M_len;
        local_148 = (curr->memory).super_IString.str._M_str;
        pLVar6 = Builder::makeLoad((Builder *)&temp,1,false,local_130,1,(Expression *)pLVar5,
                                   local_140,(Name)(curr->memory).super_IString.str);
        pCVar8 = Builder::makeConst<int>((Builder *)&temp,0x18);
        right = Builder::makeBinary((Builder *)&temp,ShlInt32,(Expression *)pLVar6,
                                    (Expression *)pCVar8);
        pBVar10 = Builder::makeBinary((Builder *)&temp,OrInt32,(Expression *)pBVar10,
                                      (Expression *)right);
        local_60 = Builder::makeBinary((Builder *)&temp,OrInt32,(Expression *)pBVar9,
                                       (Expression *)pBVar10);
      }
      else {
        aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
        if (aVar2 != 2) {
          handle_unreachable("invalid alignment",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                             ,0x84);
        }
        local_158.addr = (curr->offset).addr;
        local_160 = builder.wasm;
        pLVar5 = Builder::makeLocalGet((Builder *)&temp,local_50,(Type)builder.wasm);
        wasm::Type::Type(&local_168,i32);
        local_178 = (curr->memory).super_IString.str._M_len;
        local_170 = (curr->memory).super_IString.str._M_str;
        pLVar6 = Builder::makeLoad((Builder *)&temp,2,false,local_158,2,(Expression *)pLVar5,
                                   local_168,(Name)(curr->memory).super_IString.str);
        aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
        wasm::Address::Address(&local_180,aVar2 + 2);
        local_188 = builder.wasm;
        pLVar5 = Builder::makeLocalGet((Builder *)&temp,local_50,(Type)builder.wasm);
        wasm::Type::Type(&local_190,i32);
        local_1a0 = (curr->memory).super_IString.str._M_len;
        local_198 = (curr->memory).super_IString.str._M_str;
        pLVar7 = Builder::makeLoad((Builder *)&temp,2,false,local_180,2,(Expression *)pLVar5,
                                   local_190,(Name)(curr->memory).super_IString.str);
        pCVar8 = Builder::makeConst<int>((Builder *)&temp,0x10);
        pBVar9 = Builder::makeBinary((Builder *)&temp,ShlInt32,(Expression *)pLVar7,
                                     (Expression *)pCVar8);
        local_60 = Builder::makeBinary((Builder *)&temp,OrInt32,(Expression *)pLVar6,
                                       (Expression *)pBVar9);
      }
    }
    local_1c0 = Builder::makeLocalSet((Builder *)&temp,local_50,curr->ptr);
    local_1b8 = local_60;
    local_1b0._M_array = (iterator)&local_1c0;
    local_1b0._M_len = 2;
    this_local = (AlignmentLowering *)Builder::makeBlock((Builder *)&temp,&local_1b0);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* lowerLoadI32(Load* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    Builder builder(*getModule());
    assert(curr->type == Type::i32);
    auto temp = builder.addVar(getFunction(), indexType);
    Expression* ret;
    if (curr->bytes == 2) {
      ret = builder.makeBinary(
        OrInt32,
        builder.makeLoad(1,
                         false,
                         curr->offset,
                         1,
                         builder.makeLocalGet(temp, indexType),
                         Type::i32,
                         curr->memory),
        builder.makeBinary(
          ShlInt32,
          builder.makeLoad(1,
                           false,
                           curr->offset + 1,
                           1,
                           builder.makeLocalGet(temp, indexType),
                           Type::i32,
                           curr->memory),
          builder.makeConst(int32_t(8))));
      if (curr->signed_) {
        ret = Bits::makeSignExt(ret, 2, *getModule());
      }
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        ret = builder.makeBinary(
          OrInt32,
          builder.makeBinary(
            OrInt32,
            builder.makeLoad(1,
                             false,
                             curr->offset,
                             1,
                             builder.makeLocalGet(temp, indexType),
                             Type::i32,
                             curr->memory),
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 1,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(8)))),
          builder.makeBinary(
            OrInt32,
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 2,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(16))),
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 3,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(24)))));
      } else if (curr->align == 2) {
        ret = builder.makeBinary(
          OrInt32,
          builder.makeLoad(2,
                           false,
                           curr->offset,
                           2,
                           builder.makeLocalGet(temp, indexType),
                           Type::i32,
                           curr->memory),
          builder.makeBinary(
            ShlInt32,
            builder.makeLoad(2,
                             false,
                             curr->offset + 2,
                             2,
                             builder.makeLocalGet(temp, indexType),
                             Type::i32,
                             curr->memory),
            builder.makeConst(int32_t(16))));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    return builder.makeBlock({builder.makeLocalSet(temp, curr->ptr), ret});
  }